

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O3

string * __thiscall
cfd::core::WallyUtil::GetMnemonicWord_abi_cxx11_
          (string *__return_storage_ptr__,WallyUtil *this,words *wordlist,size_t index)

{
  CfdException *pCVar1;
  char *wally_string;
  int ret;
  char *wally_word;
  int local_54;
  string local_50;
  WallyUtil *local_30;
  words *local_28;
  
  local_28 = wordlist;
  if ((words *)0x7ff < wordlist) {
    local_50._M_dataplus._M_p = "cfdcore_wally_util.cpp";
    local_50._M_string_length._0_4_ = 0x137;
    local_50.field_2._M_allocated_capacity = (long)"CfdGetMnemonicWord" + 3;
    logger::log<unsigned_long_const&>
              ((CfdSourceLocation *)&local_50,kCfdLogLevelWarning,
               "GetMnemonicWord invalid index error. index=[{}]",(unsigned_long *)&local_28);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GetMnemonicWord invalid index error.","");
    CfdException::CfdException(pCVar1,kCfdOutOfRangeError,&local_50);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_30 = (WallyUtil *)0x0;
  local_54 = bip39_get_word((words *)this,(size_t)wordlist,(char **)&local_30);
  if (local_54 == 0) {
    ConvertStringAndFree_abi_cxx11_(__return_storage_ptr__,local_30,wally_string);
    return __return_storage_ptr__;
  }
  local_50._M_dataplus._M_p = "cfdcore_wally_util.cpp";
  local_50._M_string_length._0_4_ = 0x140;
  local_50.field_2._M_allocated_capacity = (long)"CfdGetMnemonicWord" + 3;
  logger::log<int&>((CfdSourceLocation *)&local_50,kCfdLogLevelWarning,
                    "Get languages error. ret=[{}]",&local_54);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Get languages error.","");
  CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,&local_50);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string WallyUtil::GetMnemonicWord(
    const words* wordlist, const size_t index) {
  if (kWordlistLength <= index) {
    warn(
        CFD_LOG_SOURCE, "GetMnemonicWord invalid index error. index=[{}]",
        index);
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "GetMnemonicWord invalid index error.");
  }

  char* wally_word = NULL;
  int ret = bip39_get_word(wordlist, index, &wally_word);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Get languages error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Get languages error.");
  }

  std::string word = ConvertStringAndFree(wally_word);
  return word;
}